

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void bitmanip::detail::registerTest(Test *test)

{
  int iVar1;
  unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_> local_18;
  Test *local_10;
  Test *test_local;
  
  local_10 = test;
  if (registerTest(bitmanip::Test*)::tests == '\0') {
    iVar1 = __cxa_guard_acquire(&registerTest(bitmanip::Test*)::tests);
    if (iVar1 != 0) {
      memset(&registerTest::tests,0,0x18);
      std::
      vector<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>,_std::allocator<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>_>_>
      ::vector(&registerTest::tests);
      __cxa_atexit(std::
                   vector<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>,_std::allocator<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>_>_>
                   ::~vector,&registerTest::tests,&__dso_handle);
      __cxa_guard_release(&registerTest(bitmanip::Test*)::tests);
    }
  }
  if (registerTest(bitmanip::Test*)::reg_ == '\0') {
    iVar1 = __cxa_guard_acquire(&registerTest(bitmanip::Test*)::reg_);
    if (iVar1 != 0) {
      testsPtr = &registerTest::tests;
      anyTestsRegistered = 1;
      registerTest::reg_ = 0;
      __cxa_guard_release(&registerTest(bitmanip::Test*)::reg_);
    }
  }
  std::unique_ptr<bitmanip::Test,std::default_delete<bitmanip::Test>>::
  unique_ptr<std::default_delete<bitmanip::Test>,void>
            ((unique_ptr<bitmanip::Test,std::default_delete<bitmanip::Test>> *)&local_18,local_10);
  std::
  vector<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>,_std::allocator<std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>_>_>
  ::push_back(&registerTest::tests,(value_type *)&local_18);
  std::unique_ptr<bitmanip::Test,_std::default_delete<bitmanip::Test>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

void detail::registerTest(Test *test)
{
    static std::vector<std::unique_ptr<Test>> tests{};
    [[maybe_unused]] static const int reg_ = (testsPtr = &tests, anyTestsRegistered = true, 0);

    tests.push_back(std::unique_ptr<Test>{test});
}